

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  AABBNodeMB4D *node1;
  ulong uVar7;
  long lVar8;
  RTCIntersectFunctionN p_Var9;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined4 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int mask_1;
  ulong local_1370;
  ulong local_1368;
  ulong local_1360;
  ulong local_1358;
  ulong local_1350;
  ulong local_1348;
  NodeRef *local_1340;
  RayQueryContext *local_1338;
  Scene *local_1330;
  ulong local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1340 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl((undefined1  [16])aVar2,auVar21);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      uVar10 = vcmpps_avx512vl(auVar21,auVar30,1);
      bVar19 = (bool)((byte)uVar10 & 1);
      auVar22._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * (int)aVar2.x;
      bVar19 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * (int)aVar2.y;
      bVar19 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * (int)aVar2.z;
      bVar19 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * aVar2.field_3.a;
      auVar21 = vrcp14ps_avx512vl(auVar22);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = &DAT_3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar23 = vfnmadd213ps_avx512vl(auVar22,auVar21,auVar23);
      auVar22 = vfmadd132ps_fma(auVar23,auVar21,auVar21);
      fVar25 = auVar22._0_4_;
      local_11f8._4_4_ = fVar25;
      local_11f8._0_4_ = fVar25;
      local_11f8._8_4_ = fVar25;
      local_11f8._12_4_ = fVar25;
      local_11f8._16_4_ = fVar25;
      local_11f8._20_4_ = fVar25;
      local_11f8._24_4_ = fVar25;
      local_11f8._28_4_ = fVar25;
      auVar37 = ZEXT3264(local_11f8);
      auVar21 = vmovshdup_avx(auVar22);
      uVar29 = auVar21._0_8_;
      local_1218._8_8_ = uVar29;
      local_1218._0_8_ = uVar29;
      local_1218._16_8_ = uVar29;
      local_1218._24_8_ = uVar29;
      auVar38 = ZEXT3264(local_1218);
      auVar31._8_4_ = 2;
      auVar31._0_8_ = 0x200000002;
      auVar31._12_4_ = 2;
      auVar31._16_4_ = 2;
      auVar31._20_4_ = 2;
      auVar31._24_4_ = 2;
      auVar31._28_4_ = 2;
      auVar23 = vshufpd_avx(auVar22,auVar22,1);
      local_1238 = vpermps_avx2(auVar31,ZEXT1632(auVar22));
      auVar39 = ZEXT3264(local_1238);
      fVar26 = fVar25 * (ray->org).field_0.m128[0];
      auVar33._8_4_ = 1;
      auVar33._0_8_ = 0x100000001;
      auVar33._12_4_ = 1;
      auVar33._16_4_ = 1;
      auVar33._20_4_ = 1;
      auVar33._24_4_ = 1;
      auVar33._28_4_ = 1;
      auVar27 = ZEXT1632(CONCAT412(auVar22._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar22._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar22._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar26))));
      auVar33 = vpermps_avx2(auVar33,auVar27);
      auVar27 = vpermps_avx2(auVar31,auVar27);
      uVar10 = (ulong)(fVar25 < 0.0) << 5;
      uVar11 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x40;
      uVar12 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x80;
      uVar13 = uVar10 ^ 0x20;
      uVar14 = uVar11 ^ 0x20;
      uVar18 = uVar12 ^ 0x20;
      uVar28 = auVar3._0_4_;
      local_1258._4_4_ = uVar28;
      local_1258._0_4_ = uVar28;
      local_1258._8_4_ = uVar28;
      local_1258._12_4_ = uVar28;
      local_1258._16_4_ = uVar28;
      local_1258._20_4_ = uVar28;
      local_1258._24_4_ = uVar28;
      local_1258._28_4_ = uVar28;
      auVar32 = ZEXT3264(local_1258);
      local_1278._4_4_ = fVar1;
      local_1278._0_4_ = fVar1;
      local_1278._8_4_ = fVar1;
      local_1278._12_4_ = fVar1;
      local_1278._16_4_ = fVar1;
      local_1278._20_4_ = fVar1;
      local_1278._24_4_ = fVar1;
      local_1278._28_4_ = fVar1;
      auVar36 = ZEXT3264(local_1278);
      local_1298._0_8_ = CONCAT44(fVar26,fVar26) ^ 0x8000000080000000;
      local_1298._8_4_ = -fVar26;
      local_1298._12_4_ = -fVar26;
      local_1298._16_4_ = -fVar26;
      local_1298._20_4_ = -fVar26;
      local_1298._24_4_ = -fVar26;
      local_1298._28_4_ = -fVar26;
      auVar35 = ZEXT3264(local_1298);
      local_12b8._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = auVar33._8_4_ ^ 0x80000000;
      local_12b8._12_4_ = auVar33._12_4_ ^ 0x80000000;
      local_12b8._16_4_ = auVar33._16_4_ ^ 0x80000000;
      local_12b8._20_4_ = auVar33._20_4_ ^ 0x80000000;
      local_12b8._24_4_ = auVar33._24_4_ ^ 0x80000000;
      local_12b8._28_4_ = auVar33._28_4_ ^ 0x80000000;
      auVar34 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = auVar27._8_4_ ^ 0x80000000;
      local_12d8._12_4_ = auVar27._12_4_ ^ 0x80000000;
      local_12d8._16_4_ = auVar27._16_4_ ^ 0x80000000;
      local_12d8._20_4_ = auVar27._20_4_ ^ 0x80000000;
      local_12d8._24_4_ = auVar27._24_4_ ^ 0x80000000;
      local_12d8._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar40 = ZEXT3264(local_12d8);
      local_1370 = uVar18;
      local_1368 = uVar14;
      local_1360 = uVar13;
      local_1358 = uVar12;
      local_1350 = uVar11;
      local_1348 = uVar10;
      local_1338 = context;
      do {
        if (local_1340 == stack) {
          return;
        }
        sVar16 = local_1340[-1].ptr;
        local_1340 = local_1340 + -1;
        do {
          if ((sVar16 & 8) == 0) {
            uVar7 = sVar16 & 0xfffffffffffffff0;
            uVar28 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar24._4_4_ = uVar28;
            auVar24._0_4_ = uVar28;
            auVar24._8_4_ = uVar28;
            auVar24._12_4_ = uVar28;
            auVar24._16_4_ = uVar28;
            auVar24._20_4_ = uVar28;
            auVar24._24_4_ = uVar28;
            auVar24._28_4_ = uVar28;
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar10),auVar24,
                                     *(undefined1 (*) [32])(uVar7 + 0x40 + uVar10));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar37._0_32_,auVar35._0_32_);
            auVar33 = vmaxps_avx(auVar32._0_32_,ZEXT1632(auVar3));
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar11),auVar24,
                                     *(undefined1 (*) [32])(uVar7 + 0x40 + uVar11));
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar12),auVar24,
                                      *(undefined1 (*) [32])(uVar7 + 0x40 + uVar12));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar38._0_32_,auVar34._0_32_);
            auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar39._0_32_,auVar40._0_32_);
            auVar27 = vmaxps_avx(ZEXT1632(auVar3),ZEXT1632(auVar21));
            auVar33 = vmaxps_avx(auVar33,auVar27);
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar13),auVar24,
                                     *(undefined1 (*) [32])(uVar7 + 0x40 + uVar13));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar37._0_32_,auVar35._0_32_);
            auVar27 = vminps_avx(auVar36._0_32_,ZEXT1632(auVar3));
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar14),auVar24,
                                     *(undefined1 (*) [32])(uVar7 + 0x40 + uVar14));
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar18),auVar24,
                                      *(undefined1 (*) [32])(uVar7 + 0x40 + uVar18));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar38._0_32_,auVar34._0_32_);
            auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar39._0_32_,auVar40._0_32_);
            auVar31 = vminps_avx(ZEXT1632(auVar3),ZEXT1632(auVar21));
            auVar27 = vminps_avx(auVar27,auVar31);
            if (((uint)sVar16 & 7) == 6) {
              uVar29 = vcmpps_avx512vl(auVar33,auVar27,2);
              uVar4 = vcmpps_avx512vl(auVar24,*(undefined1 (*) [32])(uVar7 + 0x1c0),0xd);
              uVar5 = vcmpps_avx512vl(auVar24,*(undefined1 (*) [32])(uVar7 + 0x1e0),1);
              bVar20 = (byte)uVar29 & (byte)uVar4 & (byte)uVar5;
            }
            else {
              uVar29 = vcmpps_avx512vl(auVar33,auVar27,2);
              bVar20 = (byte)uVar29;
            }
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar20);
          }
          if ((sVar16 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar17 = 4;
            }
            else {
              uVar15 = sVar16 & 0xfffffffffffffff0;
              lVar8 = 0;
              for (uVar7 = unaff_RBX; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                lVar8 = lVar8 + 1;
              }
              iVar17 = 0;
              for (uVar7 = unaff_RBX - 1 & unaff_RBX; sVar16 = *(size_t *)(uVar15 + lVar8 * 8),
                  uVar7 != 0; uVar7 = uVar7 - 1 & uVar7) {
                local_1340->ptr = sVar16;
                local_1340 = local_1340 + 1;
                lVar8 = 0;
                for (uVar6 = uVar7; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  lVar8 = lVar8 + 1;
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          iVar17 = 0;
          local_1328 = (ulong)((uint)sVar16 & 0xf) - 8;
          bVar19 = local_1328 != 0;
          if (bVar19) {
            local_1330 = local_1338->scene;
            uVar7 = 0;
            do {
              local_1320.geomID = *(uint *)((sVar16 & 0xfffffffffffffff0) + uVar7 * 8);
              local_12f0 = (local_1330->geometries).items[local_1320.geomID].ptr;
              if ((ray->mask & local_12f0->mask) != 0) {
                local_1320.primID = *(uint *)((sVar16 & 0xfffffffffffffff0) + 4 + uVar7 * 8);
                mask_1 = -1;
                local_1320.valid = &mask_1;
                local_1320.geometryUserPtr = local_12f0->userPtr;
                local_1320.context = local_1338->user;
                local_1320.N = 1;
                local_12e8 = 0;
                local_12e0 = local_1338->args;
                p_Var9 = local_12e0->intersect;
                if (p_Var9 == (RTCIntersectFunctionN)0x0) {
                  p_Var9 = (RTCIntersectFunctionN)
                           local_12f0[1].super_RefCount.refCounter.
                           super___atomic_base<unsigned_long>._M_i;
                }
                local_1320.rayhit = (RTCRayHitN *)ray;
                (*p_Var9)(&local_1320);
                auVar37 = ZEXT3264(local_11f8);
                auVar38 = ZEXT3264(local_1218);
                auVar39 = ZEXT3264(local_1238);
                auVar32 = ZEXT3264(local_1258);
                auVar36 = ZEXT3264(local_1278);
                auVar35 = ZEXT3264(local_1298);
                auVar34 = ZEXT3264(local_12b8);
                auVar40 = ZEXT3264(local_12d8);
                if (ray->tfar < 0.0) {
                  uVar10 = local_1348;
                  uVar11 = local_1350;
                  uVar12 = local_1358;
                  uVar13 = local_1360;
                  uVar14 = local_1368;
                  uVar18 = local_1370;
                  iVar17 = 0;
                  if (bVar19) {
                    ray->tfar = -INFINITY;
                    iVar17 = 3;
                  }
                  break;
                }
              }
              uVar7 = uVar7 + 1;
              bVar19 = uVar7 < local_1328;
              uVar10 = local_1348;
              uVar11 = local_1350;
              uVar12 = local_1358;
              uVar13 = local_1360;
              uVar14 = local_1368;
              uVar18 = local_1370;
            } while (uVar7 != local_1328);
          }
        }
      } while (iVar17 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }